

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O0

SQBool sqstd_rex_matchclass(SQRex *exp,SQRexNode *node,SQChar c)

{
  SQBool SVar1;
  bool bVar2;
  SQRexNode *pSStack_20;
  SQChar c_local;
  SQRexNode *node_local;
  SQRex *exp_local;
  
  pSStack_20 = node;
  do {
    if (pSStack_20->type == 0x106) {
      SVar1 = sqstd_rex_matchcclass(pSStack_20->left,c);
      if (SVar1 != 0) {
        return 1;
      }
    }
    else if (pSStack_20->type == 0x108) {
      if ((pSStack_20->left <= (long)c) && ((long)c <= pSStack_20->right)) {
        return 1;
      }
    }
    else if ((int)c == pSStack_20->type) {
      return 1;
    }
    bVar2 = false;
    if (pSStack_20->next != -1) {
      pSStack_20 = exp->_nodes + pSStack_20->next;
      bVar2 = pSStack_20 != (SQRexNode *)0x0;
    }
  } while (bVar2);
  return 0;
}

Assistant:

static SQBool sqstd_rex_matchclass(SQRex* exp,SQRexNode *node,SQChar c)
{
    do {
        switch(node->type) {
            case OP_RANGE:
                if(c >= node->left && c <= node->right) return SQTrue;
                break;
            case OP_CCLASS:
                if(sqstd_rex_matchcclass(node->left,c)) return SQTrue;
                break;
            default:
                if(c == node->type)return SQTrue;
        }
    } while((node->next != -1) && (node = &exp->_nodes[node->next]));
    return SQFalse;
}